

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_vcgen_contour.cpp
# Opt level: O0

void __thiscall agg::vcgen_contour::add_vertex(vcgen_contour *this,double x,double y,uint cmd)

{
  bool bVar1;
  uint uVar2;
  vertex_dist local_58;
  vertex_dist local_40;
  uint local_24;
  double dStack_20;
  uint cmd_local;
  double y_local;
  double x_local;
  vcgen_contour *this_local;
  
  this->m_status = initial;
  local_24 = cmd;
  dStack_20 = y;
  y_local = x;
  x_local = (double)this;
  bVar1 = is_move_to(cmd);
  if (bVar1) {
    vertex_dist::vertex_dist(&local_40,y_local,dStack_20);
    vertex_sequence<agg::vertex_dist,_6U>::modify_last(&this->m_src_vertices,&local_40);
  }
  else {
    bVar1 = is_vertex(local_24);
    if (bVar1) {
      vertex_dist::vertex_dist(&local_58,y_local,dStack_20);
      vertex_sequence<agg::vertex_dist,_6U>::add(&this->m_src_vertices,&local_58);
    }
    else {
      bVar1 = is_end_poly(local_24);
      if (bVar1) {
        uVar2 = get_close_flag(local_24);
        this->m_closed = uVar2;
        if (this->m_orientation == 0) {
          uVar2 = get_orientation(local_24);
          this->m_orientation = uVar2;
        }
      }
    }
  }
  return;
}

Assistant:

void vcgen_contour::add_vertex(double x, double y, unsigned cmd)
    {
        m_status = initial;
        if(is_move_to(cmd))
        {
            m_src_vertices.modify_last(vertex_dist(x, y));
        }
        else
        {
            if(is_vertex(cmd))
            {
                m_src_vertices.add(vertex_dist(x, y));
            }
            else
            {
                if(is_end_poly(cmd))
                {
                    m_closed = get_close_flag(cmd);
                    if(m_orientation == path_flags_none) 
                    {
                        m_orientation = get_orientation(cmd);
                    }
                }
            }
        }
    }